

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O1

Input * __thiscall helics::Input::operator=(Input *this,Input *param_1)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  DataType DVar7;
  DataType DVar8;
  int32_t iVar9;
  undefined4 uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 uVar15;
  MultiInputHandlingMethod MVar16;
  anon_class_8_1_8991fb9c_conflict local_20;
  
  (this->super_Interface).handle.hid = (param_1->super_Interface).handle.hid;
  (this->super_Interface).mCore = (param_1->super_Interface).mCore;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->super_Interface).mName,&(param_1->super_Interface).mName);
  this->customTypeHash = param_1->customTypeHash;
  uVar1 = *(undefined4 *)&param_1->fed;
  uVar2 = *(undefined4 *)((long)&param_1->fed + 4);
  iVar3 = param_1->referenceIndex;
  uVar4 = *(undefined4 *)&param_1->field_0x44;
  uVar5 = *(undefined4 *)&param_1->dataReference;
  uVar6 = *(undefined4 *)((long)&param_1->dataReference + 4);
  DVar7 = param_1->targetType;
  DVar8 = param_1->injectionType;
  bVar11 = param_1->hasUpdate;
  bVar12 = param_1->disableAssign;
  bVar13 = param_1->useThreshold;
  bVar14 = param_1->multiUnits;
  uVar15 = param_1->field_0x5d;
  MVar16 = param_1->inputVectorOp;
  iVar9 = param_1->prevInputCount;
  uVar10 = *(undefined4 *)&param_1->field_0x64;
  this->changeDetectionEnabled = param_1->changeDetectionEnabled;
  this->hasUpdate = bVar11;
  this->disableAssign = bVar12;
  this->useThreshold = bVar13;
  this->multiUnits = bVar14;
  this->field_0x5d = uVar15;
  this->inputVectorOp = MVar16;
  this->prevInputCount = iVar9;
  *(undefined4 *)&this->field_0x64 = uVar10;
  *(undefined4 *)&this->dataReference = uVar5;
  *(undefined4 *)((long)&this->dataReference + 4) = uVar6;
  this->targetType = DVar7;
  this->injectionType = DVar8;
  *(undefined4 *)&this->fed = uVar1;
  *(undefined4 *)((long)&this->fed + 4) = uVar2;
  this->referenceIndex = iVar3;
  *(undefined4 *)&this->field_0x44 = uVar4;
  local_20.this =
       (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)&this->lastValue;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
    ::_S_vtable._M_arr
    [(long)(char)*(__index_type *)
                  ((long)&(param_1->lastValue).
                          super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                          .
                          super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                          .
                          super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                  + 0x28) + 1]._M_data)(&local_20,&param_1->lastValue);
  (this->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->outputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->outputUnits).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(param_1->outputUnits).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (param_1->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->inputUnits).super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(param_1->inputUnits).
              super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::operator=(&this->sourceTypes,&param_1->sourceTypes);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->givenTarget,&param_1->givenTarget);
  uVar1 = *(undefined4 *)((long)&param_1->delta + 4);
  uVar2 = *(undefined4 *)&param_1->threshold;
  uVar4 = *(undefined4 *)((long)&param_1->threshold + 4);
  *(undefined4 *)&this->delta = *(undefined4 *)&param_1->delta;
  *(undefined4 *)((long)&this->delta + 4) = uVar1;
  *(undefined4 *)&this->threshold = uVar2;
  *(undefined4 *)((long)&this->threshold + 4) = uVar4;
  local_20.this =
       (_Copy_assign_base<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
        *)&this->value_callback;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:609:4)_&&,_const_std::variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(param_1->value_callback).
              super__Variant_base<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
              .
              super__Move_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
              .
              super__Copy_assign_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
              .
              super__Move_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
              .
              super__Copy_ctor_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
              .
              super__Variant_storage_alias<std::function<void_(const_double_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<double>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_std::vector<std::complex<double>_>_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9>_>_&,_TimeRepresentation<count_time<9>_>)>_>
      + 0x20)]._M_data)((anon_class_8_1_8991fb9c_conflict1 *)&local_20,&param_1->value_callback);
  return this;
}

Assistant:

class HELICS_CXX_EXPORT Input: public Interface {
  protected:
    ValueFederate* fed = nullptr;  //!< reference to the value federate
  private:
    int referenceIndex{-1};  //!< an index used for callback lookup
    void* dataReference{nullptr};  //!< pointer to a piece of containing data

    DataType targetType{DataType::HELICS_UNKNOWN};  //!< the underlying type the input targets
    DataType injectionType{
        DataType::HELICS_UNKNOWN};  //!< the type of data coming from the publication
    bool changeDetectionEnabled{false};  //!< the change detection is enabled
    bool hasUpdate{false};  //!< the value has been updated
    bool disableAssign{false};  //!< disable assignment for the object
    bool useThreshold{false};  //!< flag to indicate use a threshold for binary output
    bool multiUnits{false};  //!< flag indicating there are multiple Input Units
    MultiInputHandlingMethod inputVectorOp{
        MultiInputHandlingMethod::NO_OP};  //!< the vector processing method to use
    int32_t prevInputCount{0};  //!< the previous number of inputs
    size_t customTypeHash{0U};  //!< a hash code for the custom type
    defV lastValue{invalidDouble};  //!< the last value updated
    std::shared_ptr<units::precise_unit> outputUnits;  //!< the target output units
    std::shared_ptr<units::precise_unit> inputUnits;  //!< the units of the linked publications
    std::vector<std::pair<DataType, std::shared_ptr<units::precise_unit>>>
        sourceTypes;  //!< source information for input sources
    std::string givenTarget;  //!< the first target set for the input
    double delta{-1.0};  //!< the minimum difference
    double threshold{0.0};  //!< the threshold to use for binary decisions
    // this needs to match the defV type
    std::variant<std::function<void(const double&, Time)>,
                 std::function<void(const int64_t&, Time)>,
                 std::function<void(const std::string&, Time)>,
                 std::function<void(const std::complex<double>&, Time)>,
                 std::function<void(const std::vector<double>&, Time)>,
                 std::function<void(const std::vector<std::complex<double>>&, Time)>,
                 std::function<void(const NamedPoint&, Time)>,
                 std::function<void(const bool&, Time)>,
                 std::function<void(const Time&, Time)>>
        value_callback;  //!< callback function for the federate
  public:
    /** Default constructor*/
    Input() = default;
    /** construct from a federate and handle, mainly used by the valueFederateManager*/
    Input(ValueFederate* valueFed,
          InterfaceHandle id,
          std::string_view actName,
          std::string_view unitsOut = {});

    Input(ValueFederate* valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {});

    template<class FedPtr>
    Input(FedPtr& valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {}): Input(std::addressof(*valueFed), key, defaultType, units)
    {
        static_assert(
            std::is_base_of<ValueFederate, std::remove_reference_t<decltype(*valueFed)>>::value,
            "first argument must be a pointer to a ValueFederate");
    }

    Input(InterfaceVisibility locality,
          ValueFederate* valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {});

    template<class FedPtr>
    Input(InterfaceVisibility locality,
          FedPtr& valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {}):
        Input(locality, std::addressof(*valueFed), key, defaultType, units)
    {
        static_assert(
            std::is_base_of<ValueFederate, std::remove_reference_t<decltype(*valueFed)>>::value,
            "first argument must be a pointer to a ValueFederate");
    }

    Input(ValueFederate* valueFed,
          std::string_view key,
          DataType defType,
          std::string_view units = {}): Input(valueFed, key, typeNameStringRef(defType), units)
    {
    }

    template<class FedPtr>
    Input(FedPtr& valueFed, std::string_view key, DataType defType, std::string_view units = {}):
        Input(valueFed, key, typeNameStringRef(defType), units)
    {
    }

    Input(InterfaceVisibility locality,
          ValueFederate* valueFed,
          std::string_view key,
          std::string_view units = {}): Input(locality, valueFed, key, "def", units)
    {
    }

    template<class FedPtr>
    Input(InterfaceVisibility locality,
          FedPtr& valueFed,
          std::string_view key,
          std::string_view units = {}): Input(locality, valueFed, key, "def", units)
    {
    }

    Input(InterfaceVisibility locality,
          ValueFederate* valueFed,
          std::string_view key,
          DataType defType,
          std::string_view units = {}):
        Input(locality, valueFed, key, typeNameStringRef(defType), units)
    {
    }

    template<class FedPtr>
    Input(InterfaceVisibility locality,
          FedPtr& valueFed,
          std::string_view key,
          DataType defType,
          std::string_view units = {}):
        Input(locality, valueFed, key, typeNameStringRef(defType), units)
    {
    }

    /** get the time of the last update
    @return the time of the last update
    */
    Time getLastUpdate() const;

    /** register a callback for an update notification
    @details the callback is called in the just before the time request function returns
    @param callback a function with signature void(Time time) where time is the time the value was
    updated. This callback is a notification callback and doesn't return the value
    */
    void registerNotificationCallback(std::function<void(Time)> callback);

    /** get the type of the data coming from the publication*/
    const std::string& getPublicationType() const
    {
        return ((injectionType == DataType::HELICS_UNKNOWN) ||
                (injectionType == DataType::HELICS_CUSTOM)) ?
            getInjectionType() :
            typeNameStringRef(injectionType);
    }
    /** get the type of the input*/
    const std::string& getType() const { return getExtractionType(); }
    /** get the units associated with a input*/
    const std::string& getUnits() const { return getExtractionUnits(); }
    /** add a publication for the inputs information*/
    void addPublication(std::string_view target);
    /** add a target to the input*/
    void addTarget(std::string_view target) { addPublication(target); }
    /** check if the value has been updated
    @details if changeDetection is Enabled this function also loads the value into the buffer
    @param assumeUpdate if set to true will assume there was a publication and not check it first,
    if set to false[default] it will check the federate first
    @return true if the value has been updated*/
    bool checkUpdate(bool assumeUpdate = false);

    /** clear the isUpdated flag*/
    void clearUpdate();
    /** check if the value has been updated including interpretation of the change detection
     */
    bool isUpdated();
    /** check if the value has been updated,
    @details the const version can in some circumstances return true even if the value would not be
    updated the circumstances in which this is true are a minimum change has been set, checkUpdate
    has not been call(meaning it is a standalone copy, not the one stored with the federate, and the
    value has been published but would not trigger the change detection. If this is to be avoided
    use the non-const version or call checkUpdate before calling this function.
     */
    bool isUpdated() const;

    virtual void setOption(int32_t option, int32_t value = 1) override;
    virtual int32_t getOption(int32_t option) const override;
    /** register a callback for the update
    @details the callback is called in the just before the time request function returns
    @param callback a function with signature void(X val, Time time)
    val is the new value and time is the time the value was updated
    */
    template<class X>
    void setInputNotificationCallback(std::function<void(const X&, Time)> callback)
    {
        static_assert(
            helicsType<X>() != DataType::HELICS_CUSTOM,
            "callback type must be a primary helics type one of \"double, int64_t, named_point, bool, Time "
            "std::vector<double>, std::vector<std::complex<double>>, std::complex<double>\"");
        value_callback = std::move(callback);
        registerCallback();
    }

  private:
    template<class X>
    void setDefault_impl(std::integral_constant<int, 0> /*V*/, X&& val)
    {
        /** TODO(PT) still need to make_valid for bool and Time*/
        lastValue = make_valid(std::forward<X>(val));
    }

    template<class X>
    void setDefault_impl(std::integral_constant<int, 1> /*V*/, X&& val)
    {
        lastValue = make_valid(std::forward<X>(val));
    }

    template<class X>
    void setDefault_impl(std::integral_constant<int, 2> /*V*/, X&& val)
    {
        auto res = ValueConverter<remove_cv_ref<X>>::convert(std::forward<X>(val));
        lastValue = std::string(res.to_string());
        setDefaultBytes(res);
    }

    /** setup the callback for value callback into the federate*/
    void registerCallback();

  public:
    /** set the default value to use before any update has been published
     */
    template<class X>
    void setDefault(X&& val)
    {
        setDefault_impl<X>(typeCategory<X>(), std::forward<X>(val));
    }

    void setDefaultBytes(data_view val);
    /** set the minimum delta for change detection
    @param deltaV a double with the change in a value in order to register a different value
    */
    void setMinimumChange(double deltaV) noexcept
    {
        // this first check enables change detection if it was disabled via negative delta
        if (delta < 0.0) {
            changeDetectionEnabled = true;
        }
        delta = deltaV;
        // the second checks if we should disable from negative delta
        if (delta < 0.0) {
            changeDetectionEnabled = false;
        }
    }
    /** enable change detection
    @param enabled (optional) set to false to disable change detection true(default) to enable it
    */
    void enableChangeDetection(bool enabled = true) noexcept { changeDetectionEnabled = enabled; }

  private:
    /** deal with the callback from the application API*/
    void handleCallback(Time time);
    template<class X>
    void getValue_impl(std::integral_constant<int, primaryType> /*V*/, X& out);

    /** handle special case for character return data*/
    void getValue_impl(std::integral_constant<int, primaryType> /*V*/, char& out)
    {
        out = getValueChar();
    }

    /** handle special case for character return data*/
    void getValue_impl(std::integral_constant<int, convertibleType> /*V*/, char& out)
    {
        out = getValueChar();
    }

    template<class X>
    void getValue_impl(std::integral_constant<int, convertibleType> /*V*/, X& out)
    {
        std::conditional_t<std::is_integral<X>::value,
                           std::conditional_t<std::is_same<X, char>::value, char, int64_t>,
                           double>
            gval;
        getValue_impl(std::integral_constant<int, primaryType>(), gval);
        out = static_cast<X>(gval);
    }

    template<class X>
    void getValue_impl(std::integral_constant<int, nonConvertibleType> /*V*/, X& out)
    {
        ValueConverter<X>::interpret(getBytes(), out);
    }

    template<class X>
    X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }

    template<class X>
    X getValue_impl(std::integral_constant<int, convertibleType> /*V*/)
    {
        std::conditional_t<std::is_integral<X>::value,
                           std::conditional_t<std::is_same<X, char>::value, char, int64_t>,
                           double>
            gval;
        getValue_impl(std::integral_constant<int, primaryType>(), gval);
        return static_cast<X>(gval);
    }

    template<class X>
    X getValue_impl(std::integral_constant<int, nonConvertibleType> /*V*/)
    {
        return ValueConverter<X>::interpret(getBytes());
    }

  public:
    /** get double vector value functions to retrieve data by a C array of doubles*/
    int getValue(double* data, int maxsize);
    /** get a complex double vector value functions to retrieve data by a C array of doubles*/
    int getComplexValue(double* data, int maxsize);
    /** get string value functions to retrieve data by a C string*/
    int getValue(char* str, int maxsize);
    /** get the latest value for the input
    @param[out] out the location to store the value
    */
    template<class X>
    void getValue(X& out)
    {
        getValue_impl<X>(typeCategory<X>(), out);
    }
    /** get the most recent value
    @return the value*/
    template<class X>
    auto getValue()
    {
        return getValue_impl<remove_cv_ref<X>>(typeCategory<X>());
    }

    template<class X>
    const X& getValueRef();
    /** get the current value as a Double*/
    double getDouble() { return getValue_impl<double>(std::integral_constant<int, primaryType>()); }
    /** get the current value as a string*/
    const std::string& getString() { return getValueRef<std::string>(); }

    /** get the raw binary data*/
    data_view getBytes();
    /** get the size of the raw data*/
    size_t getByteCount();
    /** get the size of the data if it were a string*/
    size_t getStringSize();
    /** get the number of elements in the data if it were a vector*/
    size_t getVectorSize();

    /** get the HELICS data type for the input*/
    DataType getHelicsType() const { return targetType; }

    /** get the HELICS data type for the publication*/
    DataType getHelicsInjectionType() const { return injectionType; }

    MultiInputHandlingMethod getMultiInputMode() const { return inputVectorOp; }

    bool vectorDataProcess(const std::vector<std::shared_ptr<const SmallBuffer>>& dataV);

    const std::string& getTarget() const
    {
        return (!givenTarget.empty()) ? givenTarget : getSourceTargets();
    }

    virtual const std::string& getDisplayName() const override
    {
        return (mName.empty()) ? getTarget() : getName();
    }

  private:
    /** load some information about the data source such as type and units*/
    void loadSourceInformation();
    /** helper class for getting a character since that is a bit odd*/
    char getValueChar();
    /** check if updates from the federate are allowed*/
    bool allowDirectFederateUpdate() const
    {
        return hasUpdate && !changeDetectionEnabled &&
            inputVectorOp == MultiInputHandlingMethod::NO_OP;
    }
    data_view checkAndGetFedUpdate();
    void forceCoreDataUpdate();
    friend class ValueFederateManager;
}